

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

void Gia_ManDupOrderDfsChoices_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  uint uVar4;
  
  if (pObj->Value != 0xffffffff) {
    return;
  }
  if ((-1 < (int)(uint)*(undefined8 *)pObj) &&
     (uVar4 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar4 != 0x1fffffff)) {
    pGVar2 = p->pObjs;
    if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar1 = p->pNexts[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555];
    if ((ulong)uVar1 == 0) {
      Gia_ManDupOrderDfsChoices_rec(pNew,p,pObj + -(ulong)uVar4);
      Gia_ManDupOrderDfsChoices_rec(pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
      uVar3 = *(ulong *)pObj;
      if (-1 < (int)pObj[-(uVar3 & 0x1fffffff)].Value) {
        uVar4 = (uint)(uVar3 >> 0x20);
        if (-1 < (int)pObj[-(ulong)(uVar4 & 0x1fffffff)].Value) {
          uVar4 = Gia_ManAppendAnd(pNew,(uint)(uVar3 >> 0x1d) & 1 ^
                                        pObj[-(uVar3 & 0x1fffffff)].Value,
                                   pObj[-(ulong)(uVar4 & 0x1fffffff)].Value ^ uVar4 >> 0x1d & 1);
          pObj->Value = uVar4;
          return;
        }
      }
    }
    else {
      if (((int)uVar1 < 0) || (p->nObjs <= (int)uVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar2 = pGVar2 + uVar1;
      Gia_ManDupOrderDfsChoices_rec(pNew,p,pGVar2);
      Gia_ManDupOrderDfsChoices_rec(pNew,p,pObj + -(*(ulong *)pObj & 0x1fffffff));
      Gia_ManDupOrderDfsChoices_rec(pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
      uVar3 = *(ulong *)pObj;
      if (-1 < (int)pObj[-(uVar3 & 0x1fffffff)].Value) {
        uVar4 = (uint)(uVar3 >> 0x20);
        if (-1 < (int)pObj[-(ulong)(uVar4 & 0x1fffffff)].Value) {
          uVar4 = Gia_ManAppendAnd(pNew,(uint)(uVar3 >> 0x1d) & 1 ^
                                        pObj[-(uVar3 & 0x1fffffff)].Value,
                                   pObj[-(ulong)(uVar4 & 0x1fffffff)].Value ^ uVar4 >> 0x1d & 1);
          pObj->Value = uVar4;
          if ((-1 < (int)pGVar2->Value) && (-1 < (int)uVar4)) {
            pNew->pNexts[uVar4 >> 1] = pGVar2->Value >> 2;
            if ((-1 < (int)pObj->Value) && (-1 < (int)pGVar2->Value)) {
              if (pGVar2->Value >> 1 < pObj->Value >> 1) {
                return;
              }
              __assert_fail("Abc_Lit2Var(pObj->Value) > Abc_Lit2Var(pNext->Value)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                            ,0x1a3,
                            "void Gia_ManDupOrderDfsChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)"
                           );
            }
          }
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
      }
    }
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x132,"int Abc_LitNotCond(int, int)");
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                ,0x199,"void Gia_ManDupOrderDfsChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManDupOrderDfsChoices_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pNext;
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    pNext = Gia_ObjNextObj( p, Gia_ObjId(p, pObj) );
    if ( pNext )
        Gia_ManDupOrderDfsChoices_rec( pNew, p, pNext );
    Gia_ManDupOrderDfsChoices_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManDupOrderDfsChoices_rec( pNew, p, Gia_ObjFanin1(pObj) );
    pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    if ( pNext )
    {
        pNew->pNexts[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var( Abc_Lit2Var(pNext->Value) );
        assert( Abc_Lit2Var(pObj->Value) > Abc_Lit2Var(pNext->Value) );
    }
}